

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_16781328,_true,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char cVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  NodeRef *pNVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined4 uVar25;
  ulong unaff_R15;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar34;
  float fVar37;
  vint4 bi;
  undefined1 auVar29 [16];
  float fVar40;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar43;
  float fVar44;
  float fVar52;
  float fVar54;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar53;
  float fVar55;
  float fVar57;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar83;
  float fVar84;
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar85;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  vfloat4 a0;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 ai;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  vint4 ai_3;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  Precalculations pre;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar3 = ray->tfar, 0.0 <= fVar3)) {
    aVar7 = (ray->dir).field_0.field_1;
    auVar58 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar59 = vrsqrtss_avx(auVar58,auVar58);
    fVar86 = auVar59._0_4_;
    pre.depth_scale = fVar86 * 1.5 - auVar58._0_4_ * 0.5 * fVar86 * fVar86 * fVar86;
    fVar86 = (ray->dir).field_0.m128[0];
    fVar4 = (ray->dir).field_0.m128[1];
    fVar5 = (ray->dir).field_0.m128[2];
    auVar67 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
    auVar87._0_4_ = aVar7.x * auVar67._0_4_;
    auVar87._4_4_ = aVar7.y * auVar67._4_4_;
    auVar87._8_4_ = aVar7.z * auVar67._8_4_;
    auVar87._12_4_ = aVar7.field_3.w * auVar67._12_4_;
    auVar59 = vshufpd_avx(auVar87,auVar87,1);
    auVar58 = vmovshdup_avx(auVar87);
    auVar97._8_4_ = 0x80000000;
    auVar97._0_8_ = 0x8000000080000000;
    auVar97._12_4_ = 0x80000000;
    auVar90._12_4_ = 0;
    auVar90._0_12_ = ZEXT812(0);
    auVar90 = auVar90 << 0x20;
    auVar94 = vunpckhps_avx(auVar87,auVar90);
    auVar75 = vshufps_avx(auVar94,ZEXT416(auVar58._0_4_ ^ 0x80000000),0x41);
    auVar94._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
    auVar94._8_8_ = auVar59._8_8_ ^ auVar97._8_8_;
    auVar94 = vinsertps_avx(auVar94,auVar87,0x2a);
    auVar58 = vdpps_avx(auVar75,auVar75,0x7f);
    auVar59 = vdpps_avx(auVar94,auVar94,0x7f);
    auVar58 = vcmpps_avx(auVar59,auVar58,1);
    auVar58 = vshufps_avx(auVar58,auVar58,0);
    auVar58 = vblendvps_avx(auVar94,auVar75,auVar58);
    auVar59 = vdpps_avx(auVar58,auVar58,0x7f);
    auVar94 = vrsqrtss_avx(auVar59,auVar59);
    fVar92 = auVar94._0_4_;
    auVar59 = ZEXT416((uint)(fVar92 * 1.5 - auVar59._0_4_ * 0.5 * fVar92 * fVar92 * fVar92));
    auVar59 = vshufps_avx(auVar59,auVar59,0);
    auVar95._0_4_ = auVar58._0_4_ * auVar59._0_4_;
    auVar95._4_4_ = auVar58._4_4_ * auVar59._4_4_;
    auVar95._8_4_ = auVar58._8_4_ * auVar59._8_4_;
    auVar95._12_4_ = auVar58._12_4_ * auVar59._12_4_;
    auVar58 = vshufps_avx(auVar95,auVar95,0xc9);
    auVar59 = vshufps_avx(auVar87,auVar87,0xc9);
    auVar99._0_4_ = auVar59._0_4_ * auVar95._0_4_;
    auVar99._4_4_ = auVar59._4_4_ * auVar95._4_4_;
    auVar99._8_4_ = auVar59._8_4_ * auVar95._8_4_;
    auVar99._12_4_ = auVar59._12_4_ * auVar95._12_4_;
    auVar98._0_4_ = auVar58._0_4_ * auVar87._0_4_;
    auVar98._4_4_ = auVar58._4_4_ * auVar87._4_4_;
    auVar98._8_4_ = auVar58._8_4_ * auVar87._8_4_;
    auVar98._12_4_ = auVar58._12_4_ * auVar87._12_4_;
    auVar58 = vsubps_avx(auVar98,auVar99);
    auVar94 = vshufps_avx(auVar58,auVar58,0xc9);
    auVar58 = vdpps_avx(auVar94,auVar94,0x7f);
    auVar59 = vrsqrtss_avx(auVar58,auVar58);
    fVar92 = auVar59._0_4_;
    auVar58 = ZEXT416((uint)(fVar92 * 1.5 - auVar58._0_4_ * 0.5 * fVar92 * fVar92 * fVar92));
    auVar58 = vshufps_avx(auVar58,auVar58,0);
    auVar59._0_4_ = auVar94._0_4_ * auVar58._0_4_;
    auVar59._4_4_ = auVar94._4_4_ * auVar58._4_4_;
    auVar59._8_4_ = auVar94._8_4_ * auVar58._8_4_;
    auVar59._12_4_ = auVar94._12_4_ * auVar58._12_4_;
    auVar58._0_4_ = auVar67._0_4_ * auVar87._0_4_;
    auVar58._4_4_ = auVar67._4_4_ * auVar87._4_4_;
    auVar58._8_4_ = auVar67._8_4_ * auVar87._8_4_;
    auVar58._12_4_ = auVar67._12_4_ * auVar87._12_4_;
    auVar94 = vunpcklps_avx(auVar95,auVar58);
    auVar58 = vunpckhps_avx(auVar95,auVar58);
    auVar67 = vunpcklps_avx(auVar59,auVar90);
    auVar59 = vunpckhps_avx(auVar59,auVar90);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar58,auVar59)
    ;
    pre.ray_space.vx.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar94,auVar67)
    ;
    pre.ray_space.vy.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar94,auVar67)
    ;
    pNVar21 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    auVar94 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar58 = vandps_avx((undefined1  [16])aVar7,auVar67);
    auVar75._8_4_ = 0x219392ef;
    auVar75._0_8_ = 0x219392ef219392ef;
    auVar75._12_4_ = 0x219392ef;
    auVar58 = vcmpps_avx(auVar58,auVar75,1);
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = &DAT_3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    auVar59 = vdivps_avx(auVar29,(undefined1  [16])aVar7);
    auVar76._8_4_ = 0x5d5e0b6b;
    auVar76._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar76._12_4_ = 0x5d5e0b6b;
    auVar58 = vblendvps_avx(auVar59,auVar76,auVar58);
    auVar68._0_4_ = auVar58._0_4_ * 0.99999964;
    auVar68._4_4_ = auVar58._4_4_ * 0.99999964;
    auVar68._8_4_ = auVar58._8_4_ * 0.99999964;
    auVar68._12_4_ = auVar58._12_4_ * 0.99999964;
    auVar45._0_4_ = auVar58._0_4_ * 1.0000004;
    auVar45._4_4_ = auVar58._4_4_ * 1.0000004;
    auVar45._8_4_ = auVar58._8_4_ * 1.0000004;
    auVar45._12_4_ = auVar58._12_4_ * 1.0000004;
    auVar67 = vshufps_avx(auVar68,auVar68,0);
    auVar58 = vmovshdup_avx(auVar68);
    auVar75 = vshufps_avx(auVar68,auVar68,0x55);
    auVar59 = vshufpd_avx(auVar68,auVar68,1);
    auVar90 = vshufps_avx(auVar68,auVar68,0xaa);
    uVar22 = (ulong)(auVar68._0_4_ < 0.0) * 0x10;
    auVar68 = vshufps_avx(auVar45,auVar45,0);
    uVar23 = (ulong)(auVar58._0_4_ < 0.0) << 4 | 0x20;
    auVar58 = vshufps_avx(auVar45,auVar45,0x55);
    auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
    uVar24 = (ulong)(auVar59._0_4_ < 0.0) << 4 | 0x40;
    auVar59 = vshufps_avx(auVar94,auVar94,0);
    auVar94 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
    fVar3 = (ray->org).field_0.m128[0];
    auVar100._4_4_ = fVar3;
    auVar100._0_4_ = fVar3;
    auVar100._8_4_ = fVar3;
    auVar100._12_4_ = fVar3;
    fVar92 = (ray->org).field_0.m128[1];
    auVar101._4_4_ = fVar92;
    auVar101._0_4_ = fVar92;
    auVar101._8_4_ = fVar92;
    auVar101._12_4_ = fVar92;
    fVar6 = (ray->org).field_0.m128[2];
    auVar102._4_4_ = fVar6;
    auVar102._0_4_ = fVar6;
    auVar102._8_4_ = fVar6;
    auVar102._12_4_ = fVar6;
    do {
      if (pNVar21 == stack) {
        return;
      }
      uVar16 = pNVar21[-1].ptr;
      pNVar21 = pNVar21 + -1;
      do {
        if ((uVar16 & 8) == 0) {
          fVar44 = (ray->dir).field_0.m128[3];
          uVar17 = (uint)uVar16 & 7;
          uVar14 = uVar16 & 0xfffffffffffffff0;
          if (uVar17 == 3) {
            auVar29 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
            fVar44 = 1.0 - fVar44;
            auVar76 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
            fVar43 = auVar29._0_4_;
            fVar52 = auVar29._4_4_;
            fVar54 = auVar29._8_4_;
            fVar56 = auVar29._12_4_;
            auVar29 = vshufps_avx(ZEXT416((uint)(fVar44 * 0.0)),ZEXT416((uint)(fVar44 * 0.0)),0);
            fVar26 = auVar29._0_4_;
            fVar34 = auVar29._4_4_;
            fVar37 = auVar29._8_4_;
            fVar40 = auVar29._12_4_;
            fVar74 = auVar76._0_4_;
            auVar96._0_4_ = fVar74 + fVar43 * *(float *)(uVar14 + 0x110);
            fVar83 = auVar76._4_4_;
            auVar96._4_4_ = fVar83 + fVar52 * *(float *)(uVar14 + 0x114);
            fVar84 = auVar76._8_4_;
            auVar96._8_4_ = fVar84 + fVar54 * *(float *)(uVar14 + 0x118);
            fVar85 = auVar76._12_4_;
            auVar96._12_4_ = fVar85 + fVar56 * *(float *)(uVar14 + 0x11c);
            auVar30._0_4_ =
                 *(float *)(uVar14 + 0x20) * fVar86 +
                 *(float *)(uVar14 + 0x50) * fVar4 + *(float *)(uVar14 + 0x80) * fVar5;
            auVar30._4_4_ =
                 *(float *)(uVar14 + 0x24) * fVar86 +
                 *(float *)(uVar14 + 0x54) * fVar4 + *(float *)(uVar14 + 0x84) * fVar5;
            auVar30._8_4_ =
                 *(float *)(uVar14 + 0x28) * fVar86 +
                 *(float *)(uVar14 + 0x58) * fVar4 + *(float *)(uVar14 + 0x88) * fVar5;
            auVar30._12_4_ =
                 *(float *)(uVar14 + 0x2c) * fVar86 +
                 *(float *)(uVar14 + 0x5c) * fVar4 + *(float *)(uVar14 + 0x8c) * fVar5;
            auVar48._0_4_ =
                 *(float *)(uVar14 + 0x30) * fVar86 +
                 fVar4 * *(float *)(uVar14 + 0x60) + *(float *)(uVar14 + 0x90) * fVar5;
            auVar48._4_4_ =
                 *(float *)(uVar14 + 0x34) * fVar86 +
                 fVar4 * *(float *)(uVar14 + 100) + *(float *)(uVar14 + 0x94) * fVar5;
            auVar48._8_4_ =
                 *(float *)(uVar14 + 0x38) * fVar86 +
                 fVar4 * *(float *)(uVar14 + 0x68) + *(float *)(uVar14 + 0x98) * fVar5;
            auVar48._12_4_ =
                 *(float *)(uVar14 + 0x3c) * fVar86 +
                 fVar4 * *(float *)(uVar14 + 0x6c) + *(float *)(uVar14 + 0x9c) * fVar5;
            auVar79._0_4_ =
                 *(float *)(uVar14 + 0x70) * fVar4 + fVar5 * *(float *)(uVar14 + 0xa0) +
                 *(float *)(uVar14 + 0x40) * fVar86;
            auVar79._4_4_ =
                 *(float *)(uVar14 + 0x74) * fVar4 + fVar5 * *(float *)(uVar14 + 0xa4) +
                 *(float *)(uVar14 + 0x44) * fVar86;
            auVar79._8_4_ =
                 *(float *)(uVar14 + 0x78) * fVar4 + fVar5 * *(float *)(uVar14 + 0xa8) +
                 *(float *)(uVar14 + 0x48) * fVar86;
            auVar79._12_4_ =
                 *(float *)(uVar14 + 0x7c) * fVar4 + fVar5 * *(float *)(uVar14 + 0xac) +
                 *(float *)(uVar14 + 0x4c) * fVar86;
            auVar64._8_4_ = 0x7fffffff;
            auVar64._0_8_ = 0x7fffffff7fffffff;
            auVar64._12_4_ = 0x7fffffff;
            auVar29 = vandps_avx(auVar30,auVar64);
            auVar88._8_4_ = 0x219392ef;
            auVar88._0_8_ = 0x219392ef219392ef;
            auVar88._12_4_ = 0x219392ef;
            auVar29 = vcmpps_avx(auVar29,auVar88,1);
            auVar76 = vblendvps_avx(auVar30,auVar88,auVar29);
            auVar29 = vandps_avx(auVar48,auVar64);
            auVar29 = vcmpps_avx(auVar29,auVar88,1);
            auVar87 = vblendvps_avx(auVar48,auVar88,auVar29);
            auVar29 = vandps_avx(auVar79,auVar64);
            auVar29 = vcmpps_avx(auVar29,auVar88,1);
            auVar29 = vblendvps_avx(auVar79,auVar88,auVar29);
            auVar95 = vrcpps_avx(auVar76);
            fVar27 = auVar95._0_4_;
            auVar31._0_4_ = fVar27 * auVar76._0_4_;
            fVar35 = auVar95._4_4_;
            auVar31._4_4_ = fVar35 * auVar76._4_4_;
            fVar38 = auVar95._8_4_;
            auVar31._8_4_ = fVar38 * auVar76._8_4_;
            fVar41 = auVar95._12_4_;
            auVar31._12_4_ = fVar41 * auVar76._12_4_;
            auVar65._8_4_ = 0x3f800000;
            auVar65._0_8_ = &DAT_3f8000003f800000;
            auVar65._12_4_ = 0x3f800000;
            auVar76 = vsubps_avx(auVar65,auVar31);
            fVar27 = fVar27 + fVar27 * auVar76._0_4_;
            fVar35 = fVar35 + fVar35 * auVar76._4_4_;
            fVar38 = fVar38 + fVar38 * auVar76._8_4_;
            fVar41 = fVar41 + fVar41 * auVar76._12_4_;
            auVar76 = vrcpps_avx(auVar87);
            fVar44 = auVar76._0_4_;
            auVar49._0_4_ = auVar87._0_4_ * fVar44;
            fVar53 = auVar76._4_4_;
            auVar49._4_4_ = auVar87._4_4_ * fVar53;
            fVar55 = auVar76._8_4_;
            auVar49._8_4_ = auVar87._8_4_ * fVar55;
            fVar57 = auVar76._12_4_;
            auVar49._12_4_ = auVar87._12_4_ * fVar57;
            auVar76 = vsubps_avx(auVar65,auVar49);
            fVar44 = fVar44 + fVar44 * auVar76._0_4_;
            fVar53 = fVar53 + fVar53 * auVar76._4_4_;
            fVar55 = fVar55 + fVar55 * auVar76._8_4_;
            fVar57 = fVar57 + fVar57 * auVar76._12_4_;
            auVar76 = vrcpps_avx(auVar29);
            fVar28 = auVar76._0_4_;
            auVar80._0_4_ = auVar29._0_4_ * fVar28;
            fVar36 = auVar76._4_4_;
            auVar80._4_4_ = auVar29._4_4_ * fVar36;
            fVar39 = auVar76._8_4_;
            auVar80._8_4_ = auVar29._8_4_ * fVar39;
            fVar42 = auVar76._12_4_;
            auVar80._12_4_ = auVar29._12_4_ * fVar42;
            auVar29 = vsubps_avx(auVar65,auVar80);
            fVar28 = fVar28 + fVar28 * auVar29._0_4_;
            fVar36 = fVar36 + fVar36 * auVar29._4_4_;
            fVar39 = fVar39 + fVar39 * auVar29._8_4_;
            fVar42 = fVar42 + fVar42 * auVar29._12_4_;
            auVar81._0_4_ =
                 *(float *)(uVar14 + 0x20) * fVar3 +
                 *(float *)(uVar14 + 0x50) * fVar92 +
                 *(float *)(uVar14 + 0x80) * fVar6 + *(float *)(uVar14 + 0xb0);
            auVar81._4_4_ =
                 *(float *)(uVar14 + 0x24) * fVar3 +
                 *(float *)(uVar14 + 0x54) * fVar92 +
                 *(float *)(uVar14 + 0x84) * fVar6 + *(float *)(uVar14 + 0xb4);
            auVar81._8_4_ =
                 *(float *)(uVar14 + 0x28) * fVar3 +
                 *(float *)(uVar14 + 0x58) * fVar92 +
                 *(float *)(uVar14 + 0x88) * fVar6 + *(float *)(uVar14 + 0xb8);
            auVar81._12_4_ =
                 *(float *)(uVar14 + 0x2c) * fVar3 +
                 *(float *)(uVar14 + 0x5c) * fVar92 +
                 *(float *)(uVar14 + 0x8c) * fVar6 + *(float *)(uVar14 + 0xbc);
            auVar73._0_4_ =
                 *(float *)(uVar14 + 0x30) * fVar3 +
                 *(float *)(uVar14 + 0x90) * fVar6 + *(float *)(uVar14 + 0xc0) +
                 *(float *)(uVar14 + 0x60) * fVar92;
            auVar73._4_4_ =
                 *(float *)(uVar14 + 0x34) * fVar3 +
                 *(float *)(uVar14 + 0x94) * fVar6 + *(float *)(uVar14 + 0xc4) +
                 *(float *)(uVar14 + 100) * fVar92;
            auVar73._8_4_ =
                 *(float *)(uVar14 + 0x38) * fVar3 +
                 *(float *)(uVar14 + 0x98) * fVar6 + *(float *)(uVar14 + 200) +
                 *(float *)(uVar14 + 0x68) * fVar92;
            auVar73._12_4_ =
                 *(float *)(uVar14 + 0x3c) * fVar3 +
                 *(float *)(uVar14 + 0x9c) * fVar6 + *(float *)(uVar14 + 0xcc) +
                 *(float *)(uVar14 + 0x6c) * fVar92;
            auVar66._0_4_ =
                 fVar3 * *(float *)(uVar14 + 0x40) +
                 *(float *)(uVar14 + 0x70) * fVar92 +
                 *(float *)(uVar14 + 0xa0) * fVar6 + *(float *)(uVar14 + 0xd0);
            auVar66._4_4_ =
                 fVar3 * *(float *)(uVar14 + 0x44) +
                 *(float *)(uVar14 + 0x74) * fVar92 +
                 *(float *)(uVar14 + 0xa4) * fVar6 + *(float *)(uVar14 + 0xd4);
            auVar66._8_4_ =
                 fVar3 * *(float *)(uVar14 + 0x48) +
                 *(float *)(uVar14 + 0x78) * fVar92 +
                 *(float *)(uVar14 + 0xa8) * fVar6 + *(float *)(uVar14 + 0xd8);
            auVar66._12_4_ =
                 fVar3 * *(float *)(uVar14 + 0x4c) +
                 *(float *)(uVar14 + 0x7c) * fVar92 +
                 *(float *)(uVar14 + 0xac) * fVar6 + *(float *)(uVar14 + 0xdc);
            auVar10._4_4_ = fVar34 + fVar52 * *(float *)(uVar14 + 0xe4);
            auVar10._0_4_ = fVar26 + fVar43 * *(float *)(uVar14 + 0xe0);
            auVar10._8_4_ = fVar37 + fVar54 * *(float *)(uVar14 + 0xe8);
            auVar10._12_4_ = fVar40 + fVar56 * *(float *)(uVar14 + 0xec);
            auVar29 = vsubps_avx(auVar10,auVar81);
            auVar76 = vsubps_avx(auVar96,auVar81);
            auVar8._4_4_ = fVar34 + fVar52 * *(float *)(uVar14 + 0xf4);
            auVar8._0_4_ = fVar26 + fVar43 * *(float *)(uVar14 + 0xf0);
            auVar8._8_4_ = fVar37 + fVar54 * *(float *)(uVar14 + 0xf8);
            auVar8._12_4_ = fVar40 + fVar56 * *(float *)(uVar14 + 0xfc);
            auVar87 = vsubps_avx(auVar8,auVar73);
            auVar9._4_4_ = fVar52 * *(float *)(uVar14 + 0x124) + fVar83;
            auVar9._0_4_ = fVar43 * *(float *)(uVar14 + 0x120) + fVar74;
            auVar9._8_4_ = fVar54 * *(float *)(uVar14 + 0x128) + fVar84;
            auVar9._12_4_ = fVar56 * *(float *)(uVar14 + 300) + fVar85;
            auVar95 = vsubps_avx(auVar9,auVar73);
            auVar12._4_4_ = fVar52 * *(float *)(uVar14 + 0x104) + fVar34;
            auVar12._0_4_ = fVar43 * *(float *)(uVar14 + 0x100) + fVar26;
            auVar12._8_4_ = fVar54 * *(float *)(uVar14 + 0x108) + fVar37;
            auVar12._12_4_ = fVar56 * *(float *)(uVar14 + 0x10c) + fVar40;
            auVar97 = vsubps_avx(auVar12,auVar66);
            auVar11._4_4_ = fVar83 + fVar52 * *(float *)(uVar14 + 0x134);
            auVar11._0_4_ = fVar74 + fVar43 * *(float *)(uVar14 + 0x130);
            auVar11._8_4_ = fVar84 + fVar54 * *(float *)(uVar14 + 0x138);
            auVar11._12_4_ = fVar85 + fVar56 * *(float *)(uVar14 + 0x13c);
            auVar98 = vsubps_avx(auVar11,auVar66);
            auVar89._0_4_ = fVar27 * auVar29._0_4_;
            auVar89._4_4_ = fVar35 * auVar29._4_4_;
            auVar89._8_4_ = fVar38 * auVar29._8_4_;
            auVar89._12_4_ = fVar41 * auVar29._12_4_;
            auVar82._0_4_ = fVar27 * auVar76._0_4_;
            auVar82._4_4_ = fVar35 * auVar76._4_4_;
            auVar82._8_4_ = fVar38 * auVar76._8_4_;
            auVar82._12_4_ = fVar41 * auVar76._12_4_;
            auVar93._0_4_ = auVar87._0_4_ * fVar44;
            auVar93._4_4_ = auVar87._4_4_ * fVar53;
            auVar93._8_4_ = auVar87._8_4_ * fVar55;
            auVar93._12_4_ = auVar87._12_4_ * fVar57;
            auVar91._0_4_ = auVar97._0_4_ * fVar28;
            auVar91._4_4_ = auVar97._4_4_ * fVar36;
            auVar91._8_4_ = auVar97._8_4_ * fVar39;
            auVar91._12_4_ = auVar97._12_4_ * fVar42;
            auVar50._0_4_ = auVar95._0_4_ * fVar44;
            auVar50._4_4_ = auVar95._4_4_ * fVar53;
            auVar50._8_4_ = auVar95._8_4_ * fVar55;
            auVar50._12_4_ = auVar95._12_4_ * fVar57;
            auVar32._0_4_ = auVar98._0_4_ * fVar28;
            auVar32._4_4_ = auVar98._4_4_ * fVar36;
            auVar32._8_4_ = auVar98._8_4_ * fVar39;
            auVar32._12_4_ = auVar98._12_4_ * fVar42;
            auVar29 = vpminsd_avx(auVar93,auVar50);
            auVar76 = vpminsd_avx(auVar91,auVar32);
            auVar29 = vmaxps_avx(auVar29,auVar76);
            auVar97 = vpminsd_avx(auVar89,auVar82);
            auVar95 = vpmaxsd_avx(auVar89,auVar82);
            auVar76 = vpmaxsd_avx(auVar93,auVar50);
            auVar87 = vpmaxsd_avx(auVar91,auVar32);
            auVar87 = vminps_avx(auVar76,auVar87);
            auVar76 = vmaxps_avx(auVar59,auVar97);
            auVar29 = vmaxps_avx(auVar76,auVar29);
            auVar76 = vminps_avx(auVar94,auVar95);
            auVar76 = vminps_avx(auVar76,auVar87);
            auVar51._0_4_ = auVar29._0_4_ * 0.99999964;
            auVar51._4_4_ = auVar29._4_4_ * 0.99999964;
            auVar51._8_4_ = auVar29._8_4_ * 0.99999964;
            auVar51._12_4_ = auVar29._12_4_ * 0.99999964;
            auVar33._0_4_ = auVar76._0_4_ * 1.0000004;
            auVar33._4_4_ = auVar76._4_4_ * 1.0000004;
            auVar33._8_4_ = auVar76._8_4_ * 1.0000004;
            auVar33._12_4_ = auVar76._12_4_ * 1.0000004;
            auVar29 = vcmpps_avx(auVar51,auVar33,2);
          }
          else {
            auVar95 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar22);
            fVar44 = auVar95._0_4_;
            fVar28 = auVar95._4_4_;
            fVar53 = auVar95._8_4_;
            fVar36 = auVar95._12_4_;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar22);
            auVar46._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar46._4_4_ = fVar28 * pfVar2[1] + pfVar1[1];
            auVar46._8_4_ = fVar53 * pfVar2[2] + pfVar1[2];
            auVar46._12_4_ = fVar36 * pfVar2[3] + pfVar1[3];
            auVar29 = vsubps_avx(auVar46,auVar100);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar23);
            auVar47._0_4_ = auVar67._0_4_ * auVar29._0_4_;
            auVar47._4_4_ = auVar67._4_4_ * auVar29._4_4_;
            auVar47._8_4_ = auVar67._8_4_ * auVar29._8_4_;
            auVar47._12_4_ = auVar67._12_4_ * auVar29._12_4_;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar23);
            auVar60._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar60._4_4_ = fVar28 * pfVar2[1] + pfVar1[1];
            auVar60._8_4_ = fVar53 * pfVar2[2] + pfVar1[2];
            auVar60._12_4_ = fVar36 * pfVar2[3] + pfVar1[3];
            auVar29 = vsubps_avx(auVar60,auVar101);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar24);
            auVar69._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar69._4_4_ = fVar28 * pfVar2[1] + pfVar1[1];
            auVar69._8_4_ = fVar53 * pfVar2[2] + pfVar1[2];
            auVar69._12_4_ = fVar36 * pfVar2[3] + pfVar1[3];
            auVar61._0_4_ = auVar75._0_4_ * auVar29._0_4_;
            auVar61._4_4_ = auVar75._4_4_ * auVar29._4_4_;
            auVar61._8_4_ = auVar75._8_4_ * auVar29._8_4_;
            auVar61._12_4_ = auVar75._12_4_ * auVar29._12_4_;
            auVar29 = vsubps_avx(auVar69,auVar102);
            auVar70._0_4_ = auVar90._0_4_ * auVar29._0_4_;
            auVar70._4_4_ = auVar90._4_4_ * auVar29._4_4_;
            auVar70._8_4_ = auVar90._8_4_ * auVar29._8_4_;
            auVar70._12_4_ = auVar90._12_4_ * auVar29._12_4_;
            auVar29 = vmaxps_avx(auVar61,auVar70);
            auVar76 = vmaxps_avx(auVar59,auVar47);
            auVar29 = vmaxps_avx(auVar76,auVar29);
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar22 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar22 ^ 0x10));
            auVar62._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar62._4_4_ = fVar28 * pfVar2[1] + pfVar1[1];
            auVar62._8_4_ = fVar53 * pfVar2[2] + pfVar1[2];
            auVar62._12_4_ = fVar36 * pfVar2[3] + pfVar1[3];
            auVar76 = vsubps_avx(auVar62,auVar100);
            auVar63._0_4_ = auVar68._0_4_ * auVar76._0_4_;
            auVar63._4_4_ = auVar68._4_4_ * auVar76._4_4_;
            auVar63._8_4_ = auVar68._8_4_ * auVar76._8_4_;
            auVar63._12_4_ = auVar68._12_4_ * auVar76._12_4_;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar23 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar23 ^ 0x10));
            auVar71._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar71._4_4_ = fVar28 * pfVar2[1] + pfVar1[1];
            auVar71._8_4_ = fVar53 * pfVar2[2] + pfVar1[2];
            auVar71._12_4_ = fVar36 * pfVar2[3] + pfVar1[3];
            auVar76 = vsubps_avx(auVar71,auVar101);
            auVar72._0_4_ = auVar58._0_4_ * auVar76._0_4_;
            auVar72._4_4_ = auVar58._4_4_ * auVar76._4_4_;
            auVar72._8_4_ = auVar58._8_4_ * auVar76._8_4_;
            auVar72._12_4_ = auVar58._12_4_ * auVar76._12_4_;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar24 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar24 ^ 0x10));
            auVar77._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar77._4_4_ = fVar28 * pfVar2[1] + pfVar1[1];
            auVar77._8_4_ = fVar53 * pfVar2[2] + pfVar1[2];
            auVar77._12_4_ = fVar36 * pfVar2[3] + pfVar1[3];
            auVar76 = vsubps_avx(auVar77,auVar102);
            auVar78._0_4_ = auVar45._0_4_ * auVar76._0_4_;
            auVar78._4_4_ = auVar45._4_4_ * auVar76._4_4_;
            auVar78._8_4_ = auVar45._8_4_ * auVar76._8_4_;
            auVar78._12_4_ = auVar45._12_4_ * auVar76._12_4_;
            auVar76 = vminps_avx(auVar72,auVar78);
            auVar87 = vminps_avx(auVar94,auVar63);
            auVar76 = vminps_avx(auVar87,auVar76);
            if (uVar17 == 6) {
              auVar76 = vcmpps_avx(auVar29,auVar76,2);
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0xe0),auVar95,2);
              auVar87 = vcmpps_avx(auVar95,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
              auVar29 = vandps_avx(auVar29,auVar87);
              auVar29 = vandps_avx(auVar29,auVar76);
            }
            else {
              auVar29 = vcmpps_avx(auVar29,auVar76,2);
            }
            auVar29 = vpslld_avx(auVar29,0x1f);
          }
          uVar25 = vmovmskps_avx(auVar29);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar25);
        }
        if ((uVar16 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar18 = 4;
          }
          else {
            uVar14 = uVar16 & 0xfffffffffffffff0;
            lVar20 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            iVar18 = 0;
            uVar16 = *(ulong *)(uVar14 + lVar20 * 8);
            uVar19 = unaff_R15 - 1 & unaff_R15;
            if (uVar19 != 0) {
              pNVar21->ptr = uVar16;
              lVar20 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              uVar15 = uVar19 - 1;
              while( true ) {
                pNVar21 = pNVar21 + 1;
                uVar16 = *(ulong *)(uVar14 + lVar20 * 8);
                uVar15 = uVar15 & uVar19;
                if (uVar15 == 0) break;
                pNVar21->ptr = uVar16;
                lVar20 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                uVar19 = uVar15 - 1;
              }
            }
          }
        }
        else {
          iVar18 = 6;
        }
      } while (iVar18 == 0);
      if (iVar18 == 6) {
        cVar13 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 8))
                           (&pre,ray,context);
        iVar18 = 0;
        if (cVar13 != '\0') {
          ray->tfar = -INFINITY;
          iVar18 = 3;
        }
      }
    } while (iVar18 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }